

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inversion.hpp
# Opt level: O0

void __thiscall OpenMD::Inversion::~Inversion(Inversion *this)

{
  ShortRangeInteraction *in_RDI;
  
  in_RDI->_vptr_ShortRangeInteraction = (_func_int **)&PTR__Inversion_0034c548;
  std::__cxx11::string::~string((string *)&in_RDI[1].atoms_);
  ShortRangeInteraction::~ShortRangeInteraction(in_RDI);
  return;
}

Assistant:

virtual ~Inversion() {}